

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

bool __thiscall CASC_ARRAY::EnlargeArray(CASC_ARRAY *this,size_t NewItemCount)

{
  LPBYTE pBVar1;
  ulong local_30;
  size_t ItemCountMax;
  LPBYTE NewItemArray;
  size_t NewItemCount_local;
  CASC_ARRAY *this_local;
  
  if (this->m_pItemArray == (LPBYTE)0x0) {
    __assert_fail("m_pItemArray != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/../common/Array.h"
                  ,0x99,"bool CASC_ARRAY::EnlargeArray(size_t)");
  }
  if (this->m_ItemCountMax != 0) {
    if (this->m_ItemCountMax < NewItemCount) {
      for (local_30 = this->m_ItemCountMax; local_30 < NewItemCount; local_30 = local_30 << 1) {
      }
      pBVar1 = (LPBYTE)realloc(this->m_pItemArray,local_30 * this->m_ItemSize);
      if (pBVar1 == (LPBYTE)0x0) {
        return false;
      }
      this->m_ItemCountMax = local_30;
      this->m_pItemArray = pBVar1;
    }
    return true;
  }
  __assert_fail("m_ItemCountMax != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/../common/Array.h"
                ,0x9a,"bool CASC_ARRAY::EnlargeArray(size_t)");
}

Assistant:

bool EnlargeArray(size_t NewItemCount)
    {
        LPBYTE NewItemArray;
        size_t ItemCountMax;

        // We expect the array to be already allocated
        assert(m_pItemArray != NULL);
        assert(m_ItemCountMax != 0);

        // Shall we enlarge the table?
        if (NewItemCount > m_ItemCountMax)
        {
            // Calculate new table size
            ItemCountMax = m_ItemCountMax;
            while (ItemCountMax < NewItemCount)
                ItemCountMax = ItemCountMax << 1;

            // Allocate new table
            NewItemArray = CASC_REALLOC(BYTE, m_pItemArray, (ItemCountMax * m_ItemSize));
            if (NewItemArray == NULL)
                return false;

            // Set the new table size
            m_ItemCountMax = ItemCountMax;
            m_pItemArray = NewItemArray;
        }

        return true;
    }